

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O0

int run_test_fs_access(void)

{
  uv_file file_00;
  int iVar1;
  uv_loop_t *puVar2;
  undefined1 local_1c8 [4];
  uv_file file;
  uv_fs_t req;
  int r;
  
  unlink("test_file");
  rmdir("test_dir");
  loop = uv_default_loop();
  req.bufsml[3].len._4_4_ =
       uv_fs_access((uv_loop_t *)0x0,(uv_fs_t *)local_1c8,"test_file",0,(uv_fs_cb)0x0);
  if (-1 < req.bufsml[3].len._4_4_) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x5c7,"r < 0");
    abort();
  }
  if (-1 < (long)req.cb) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x5c8,"req.result < 0");
    abort();
  }
  uv_fs_req_cleanup((uv_fs_t *)local_1c8);
  req.bufsml[3].len._4_4_ = uv_fs_access(loop,(uv_fs_t *)local_1c8,"test_file",0,access_cb);
  if (req.bufsml[3].len._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x5cd,"r == 0");
    abort();
  }
  uv_run(loop,UV_RUN_DEFAULT);
  if (access_cb_count != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x5cf,"access_cb_count == 1");
    abort();
  }
  access_cb_count = 0;
  req.bufsml[3].len._4_4_ =
       uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)local_1c8,"test_file",0x42,0x180,(uv_fs_cb)0x0);
  if (req.bufsml[3].len._4_4_ < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x5d5,"r >= 0");
    abort();
  }
  if ((long)req.cb < 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x5d6,"req.result >= 0");
    abort();
  }
  file_00 = (uv_file)req.cb;
  uv_fs_req_cleanup((uv_fs_t *)local_1c8);
  req.bufsml[3].len._4_4_ =
       uv_fs_access((uv_loop_t *)0x0,(uv_fs_t *)local_1c8,"test_file",0,(uv_fs_cb)0x0);
  if (req.bufsml[3].len._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x5dc,"r == 0");
    abort();
  }
  if (req.cb != (uv_fs_cb)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x5dd,"req.result == 0");
    abort();
  }
  uv_fs_req_cleanup((uv_fs_t *)local_1c8);
  req.bufsml[3].len._4_4_ = uv_fs_access(loop,(uv_fs_t *)local_1c8,"test_file",0,access_cb);
  if (req.bufsml[3].len._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x5e2,"r == 0");
    abort();
  }
  uv_run(loop,UV_RUN_DEFAULT);
  if (access_cb_count != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x5e4,"access_cb_count == 1");
    abort();
  }
  access_cb_count = 0;
  req.bufsml[3].len._4_4_ = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)local_1c8,file_00,(uv_fs_cb)0x0)
  ;
  if (req.bufsml[3].len._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x5e9,"r == 0");
    abort();
  }
  if (req.cb != (uv_fs_cb)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x5ea,"req.result == 0");
    abort();
  }
  uv_fs_req_cleanup((uv_fs_t *)local_1c8);
  req.bufsml[3].len._4_4_ =
       uv_fs_mkdir((uv_loop_t *)0x0,(uv_fs_t *)local_1c8,"test_dir",0x1ff,(uv_fs_cb)0x0);
  if (req.bufsml[3].len._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x5ef,"r == 0");
    abort();
  }
  uv_fs_req_cleanup((uv_fs_t *)local_1c8);
  req.bufsml[3].len._4_4_ =
       uv_fs_access((uv_loop_t *)0x0,(uv_fs_t *)local_1c8,"test_dir",2,(uv_fs_cb)0x0);
  if (req.bufsml[3].len._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x5f3,"r == 0");
    abort();
  }
  if (req.cb != (uv_fs_cb)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x5f4,"req.result == 0");
    abort();
  }
  uv_fs_req_cleanup((uv_fs_t *)local_1c8);
  uv_run(loop,UV_RUN_DEFAULT);
  unlink("test_file");
  rmdir("test_dir");
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x601,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(fs_access) {
  int r;
  uv_fs_t req;
  uv_file file;

  /* Setup. */
  unlink("test_file");
  rmdir("test_dir");

  loop = uv_default_loop();

  /* File should not exist */
  r = uv_fs_access(NULL, &req, "test_file", F_OK, NULL);
  ASSERT(r < 0);
  ASSERT(req.result < 0);
  uv_fs_req_cleanup(&req);

  /* File should not exist */
  r = uv_fs_access(loop, &req, "test_file", F_OK, access_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(access_cb_count == 1);
  access_cb_count = 0; /* reset for the next test */

  /* Create file */
  r = uv_fs_open(NULL, &req, "test_file", O_RDWR | O_CREAT,
                 S_IWUSR | S_IRUSR, NULL);
  ASSERT(r >= 0);
  ASSERT(req.result >= 0);
  file = req.result;
  uv_fs_req_cleanup(&req);

  /* File should exist */
  r = uv_fs_access(NULL, &req, "test_file", F_OK, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  /* File should exist */
  r = uv_fs_access(loop, &req, "test_file", F_OK, access_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(access_cb_count == 1);
  access_cb_count = 0; /* reset for the next test */

  /* Close file */
  r = uv_fs_close(NULL, &req, file, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  /* Directory access */
  r = uv_fs_mkdir(NULL, &req, "test_dir", 0777, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&req);

  r = uv_fs_access(NULL, &req, "test_dir", W_OK, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);
  uv_fs_req_cleanup(&req);

  /*
   * Run the loop just to check we don't have make any extraneous uv_ref()
   * calls. This should drop out immediately.
   */
  uv_run(loop, UV_RUN_DEFAULT);

  /* Cleanup. */
  unlink("test_file");
  rmdir("test_dir");

  MAKE_VALGRIND_HAPPY();
  return 0;
}